

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairTools.cpp
# Opt level: O0

uint16_t wirehair::GetPeelSeed(uint N)

{
  byte bVar1;
  uint subdivision;
  uint N_local;
  ushort local_2;
  
  if (N < 0x800) {
    bVar1 = kSmallPeelSeeds[N];
  }
  else {
    bVar1 = kPeelSeeds[N & 0x7ff];
  }
  local_2 = (ushort)bVar1;
  return local_2;
}

Assistant:

uint16_t GetPeelSeed(unsigned N)
{
    if (N < (kTinyTableCount + kSmallTableCount)) {
        return kSmallPeelSeeds[N];
    }

    CAT_DEBUG_ASSERT(N >= kSmallTableCount && N <= 64000);

    const unsigned subdivision = N % kPeelSeedSubdivisions;

    // Get seed from subdivided table
    return kPeelSeeds[subdivision];
}